

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O0

void updateParity(DdNode *node,ApproxInfo *info,int newparity)

{
  st__table *node_00;
  int iVar1;
  DdNode *E;
  NodeData *infoN;
  ApproxInfo *pAStack_18;
  int newparity_local;
  ApproxInfo *info_local;
  DdNode *node_local;
  
  infoN._4_4_ = newparity;
  pAStack_18 = info;
  info_local = (ApproxInfo *)node;
  iVar1 = st__lookup(info->table,(char *)node,(char **)&E);
  if (((iVar1 != 0) && (((int)*(short *)((long)&E->type + 6) & infoN._4_4_) == 0)) &&
     (*(ushort *)((long)&E->type + 6) = *(ushort *)((long)&E->type + 6) | (ushort)infoN._4_4_,
     *(int *)((ulong)info_local & 0xfffffffffffffffe) != 0x7fffffff)) {
    updateParity((DdNode *)info_local->page,pAStack_18,infoN._4_4_);
    node_00 = info_local->table;
    if (((ulong)node_00 & 1) == 0) {
      updateParity((DdNode *)node_00,pAStack_18,infoN._4_4_);
    }
    else {
      updateParity((DdNode *)((ulong)node_00 ^ 1),pAStack_18,3 - infoN._4_4_);
    }
  }
  return;
}

Assistant:

static void
updateParity(
  DdNode * node /* function to analyze */,
  ApproxInfo * info /* info on BDD */,
  int  newparity /* new parity for node */)
{
    NodeData *infoN;
    DdNode *E;

    if (! st__lookup(info->table, (const char *)node, (char **)&infoN)) return;
    if ((infoN->parity & newparity) != 0) return;
    infoN->parity |= (short) newparity;
    if (Cudd_IsConstant(node)) return;
    updateParity(cuddT(node),info,newparity);
    E = cuddE(node);
    if (Cudd_IsComplement(E)) {
        updateParity(Cudd_Not(E),info,3-newparity);
    } else {
        updateParity(E,info,newparity);
    }
    return;

}